

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STEPFile.h
# Opt level: O0

Object * Assimp::STEP::ObjectHelper<Assimp::IFC::Schema_2x3::NotImplemented,_0UL>::Construct
                   (DB *db,LIST *params)

{
  unique_ptr<Assimp::IFC::Schema_2x3::NotImplemented,_std::default_delete<Assimp::IFC::Schema_2x3::NotImplemented>_>
  uVar1;
  NotImplemented *this;
  type pNVar2;
  pointer pNVar3;
  Object *local_68;
  size_t num_args;
  unique_ptr<Assimp::IFC::Schema_2x3::NotImplemented,_std::default_delete<Assimp::IFC::Schema_2x3::NotImplemented>_>
  local_20;
  unique_ptr<Assimp::IFC::Schema_2x3::NotImplemented,_std::default_delete<Assimp::IFC::Schema_2x3::NotImplemented>_>
  impl;
  LIST *params_local;
  DB *db_local;
  
  impl._M_t.
  super___uniq_ptr_impl<Assimp::IFC::Schema_2x3::NotImplemented,_std::default_delete<Assimp::IFC::Schema_2x3::NotImplemented>_>
  ._M_t.
  super__Tuple_impl<0UL,_Assimp::IFC::Schema_2x3::NotImplemented_*,_std::default_delete<Assimp::IFC::Schema_2x3::NotImplemented>_>
  .super__Head_base<0UL,_Assimp::IFC::Schema_2x3::NotImplemented_*,_false>._M_head_impl =
       (__uniq_ptr_data<Assimp::IFC::Schema_2x3::NotImplemented,_std::default_delete<Assimp::IFC::Schema_2x3::NotImplemented>,_true,_true>
        )(__uniq_ptr_data<Assimp::IFC::Schema_2x3::NotImplemented,_std::default_delete<Assimp::IFC::Schema_2x3::NotImplemented>,_true,_true>
          )params;
  this = (NotImplemented *)operator_new(0x28);
  *(undefined8 *)
   &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::NotImplemented,_0UL>).field_0x10 = 0;
  *(undefined8 *)
   &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::NotImplemented,_0UL>).field_0x18 = 0;
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::NotImplemented,_0UL>)._vptr_ObjectHelper =
       (_func_int **)0x0;
  *(undefined8 *)&(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::NotImplemented,_0UL>).field_0x8
       = 0;
  *(undefined8 *)
   &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::NotImplemented,_0UL>).field_0x20 = 0;
  Assimp::IFC::Schema_2x3::NotImplemented::NotImplemented(this);
  std::
  unique_ptr<Assimp::IFC::Schema_2x3::NotImplemented,std::default_delete<Assimp::IFC::Schema_2x3::NotImplemented>>
  ::unique_ptr<std::default_delete<Assimp::IFC::Schema_2x3::NotImplemented>,void>
            ((unique_ptr<Assimp::IFC::Schema_2x3::NotImplemented,std::default_delete<Assimp::IFC::Schema_2x3::NotImplemented>>
              *)&local_20,this);
  uVar1 = impl;
  pNVar2 = std::
           unique_ptr<Assimp::IFC::Schema_2x3::NotImplemented,_std::default_delete<Assimp::IFC::Schema_2x3::NotImplemented>_>
           ::operator*(&local_20);
  GenericFill<Assimp::IFC::Schema_2x3::NotImplemented>
            (db,(LIST *)uVar1._M_t.
                        super___uniq_ptr_impl<Assimp::IFC::Schema_2x3::NotImplemented,_std::default_delete<Assimp::IFC::Schema_2x3::NotImplemented>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_Assimp::IFC::Schema_2x3::NotImplemented_*,_std::default_delete<Assimp::IFC::Schema_2x3::NotImplemented>_>
                        .super__Head_base<0UL,_Assimp::IFC::Schema_2x3::NotImplemented_*,_false>.
                        _M_head_impl,pNVar2);
  pNVar3 = std::
           unique_ptr<Assimp::IFC::Schema_2x3::NotImplemented,_std::default_delete<Assimp::IFC::Schema_2x3::NotImplemented>_>
           ::release(&local_20);
  local_68 = (Object *)0x0;
  if (pNVar3 != (pointer)0x0) {
    local_68 = (Object *)
               ((long)&(pNVar3->super_ObjectHelper<Assimp::IFC::Schema_2x3::NotImplemented,_0UL>).
                       _vptr_ObjectHelper +
               (long)(pNVar3->super_ObjectHelper<Assimp::IFC::Schema_2x3::NotImplemented,_0UL>).
                     _vptr_ObjectHelper[-3]);
  }
  std::
  unique_ptr<Assimp::IFC::Schema_2x3::NotImplemented,_std::default_delete<Assimp::IFC::Schema_2x3::NotImplemented>_>
  ::~unique_ptr(&local_20);
  return local_68;
}

Assistant:

static Object* Construct(const STEP::DB& db, const EXPRESS::LIST& params) {
            // make sure we don't leak if Fill() throws an exception
            std::unique_ptr<TDerived> impl(new TDerived());

            // GenericFill<T> is undefined so we need to have a specialization
            const size_t num_args = GenericFill<TDerived>(db,params,&*impl);
            (void)num_args;

            // the following check is commented because it will always trigger if
            // parts of the entities are generated with dummy wrapper code.
            // This is currently done to reduce the size of the loader
            // code.
            //if (num_args != params.GetSize() && impl->GetClassName() != "NotImplemented") {
            //  DefaultLogger::get()->debug("STEP: not all parameters consumed");
            //}
            return impl.release();
        }